

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void zeroblobFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  ulong uVar1;
  
  uVar1 = sqlite3VdbeIntValue(*argv);
  if ((long)uVar1 < 1) {
    uVar1 = 0;
  }
  if ((ulong)(long)context->pOut->db->aLimit[0] < uVar1) {
    sqlite3_result_error_code(context,0x12);
    return;
  }
  sqlite3VdbeMemSetZeroBlob(context->pOut,(int)uVar1);
  return;
}

Assistant:

static void zeroblobFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  i64 n;
  int rc;
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  n = sqlite3_value_int64(argv[0]);
  if( n<0 ) n = 0;
  rc = sqlite3_result_zeroblob64(context, n); /* IMP: R-00293-64994 */
  if( rc ){
    sqlite3_result_error_code(context, rc);
  }
}